

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

ssize_t correct_reed_solomon_decode_with_erasures
                  (correct_reed_solomon *rs,uint8_t *encoded,size_t encoded_length,
                  uint8_t *erasure_locations,size_t erasure_length,uint8_t *msg)

{
  polynomial_t polynomial;
  polynomial_t locator_log;
  field_t fVar1;
  field_t field;
  polynomial_t msgpoly;
  field_t field_00;
  polynomial_t r;
  field_t field_01;
  polynomial_t l;
  polynomial_t error_locator;
  field_t field_02;
  polynomial_t res;
  _Bool _Var2;
  field_element_t fVar3;
  uint uVar4;
  uint uVar5;
  void *__dest;
  field_element_t *pfVar7;
  long in_RCX;
  uint uVar8;
  ulong in_RDX;
  long in_RSI;
  ulong *in_RDI;
  ulong in_R8;
  long in_R9;
  polynomial_t pVar9;
  correct_reed_solomon *in_stack_00000010;
  uint i_7;
  uint i_6;
  polynomial_t placeholder_poly;
  polynomial_t temp_poly;
  uint i_5;
  uint order;
  uint i_4;
  field_element_t *syndrome_copy;
  uint i_3;
  _Bool all_zero;
  uint i_2;
  uint i_1;
  uint i;
  size_t pad_length;
  size_t msg_length;
  uint in_stack_ffffffffffffff3c;
  uint num_errors;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  field_logarithm_t *in_stack_ffffffffffffff48;
  ulong *syndromes;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  field_logarithm_t generator_root_gap;
  field_element_t *in_stack_ffffffffffffff58;
  field_logarithm_t *in_stack_ffffffffffffff60;
  ulong uVar10;
  field_element_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar12;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  correct_reed_solomon *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar13;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_8;
  field_element_t *pfVar6;
  
  if (in_R8 == 0) {
    local_8 = correct_reed_solomon_decode
                        (in_stack_ffffffffffffff88,
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else if (*in_RDI < in_RDX) {
    local_8 = 0xffffffffffffffff;
  }
  else if (in_RDI[2] < in_R8) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = in_RDX - in_RDI[2];
    uVar10 = *in_RDI;
    if ((in_RDI[0x26] & 1) == 0) {
      correct_reed_solomon_decoder_create(in_stack_00000010);
    }
    for (local_4c = 0; local_4c < in_RDX; local_4c = local_4c + 1) {
      *(undefined1 *)(in_RDI[0x10] + (ulong)local_4c) =
           *(undefined1 *)(in_RSI + (in_RDX - (local_4c + 1)));
    }
    for (local_50 = 0; (ulong)local_50 < uVar10 - in_RDX; local_50 = local_50 + 1) {
      *(undefined1 *)(in_RDI[0x10] + local_50 + in_RDX) = 0;
    }
    for (local_54 = 0; local_54 < in_R8; local_54 = local_54 + 1) {
      *(char *)(in_RDI[0x1a] + (ulong)local_54) =
           (char)*in_RDI - (*(char *)(in_RCX + (ulong)local_54) + (char)(uVar10 - in_RDX) + '\x01');
    }
    fVar1.log = in_stack_ffffffffffffff60;
    fVar1.exp = in_stack_ffffffffffffff58;
    reed_solomon_find_error_roots_from_locations
              (fVar1,(field_logarithm_t)((uint)in_stack_ffffffffffffff54 >> 0x18),
               in_stack_ffffffffffffff48,
               (field_element_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff3c);
    field.log = in_stack_ffffffffffffff60;
    field.exp = in_stack_ffffffffffffff58;
    pVar9.order = in_stack_ffffffffffffff50;
    pVar9.coeff = (field_element_t *)in_RDI;
    pVar9._12_4_ = in_stack_ffffffffffffff54;
    syndromes = in_RDI;
    pVar9 = reed_solomon_find_error_locator_from_roots
                      (field,in_stack_ffffffffffffff44,(field_element_t *)(in_RDI + 0x22),pVar9,
                       (polynomial_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                      );
    pfVar6 = pVar9.coeff;
    uVar13 = pVar9.order;
    syndromes[0x16] = (ulong)pfVar6;
    syndromes[0x17] = CONCAT44(in_stack_ffffffffffffffa4,uVar13);
    field_01.log._0_4_ = in_stack_ffffffffffffff70;
    field_01.exp = in_stack_ffffffffffffff68;
    field_01.log._4_4_ = in_stack_ffffffffffffff74;
    msgpoly._8_8_ = in_stack_ffffffffffffff60;
    msgpoly.coeff = in_stack_ffffffffffffff58;
    _Var2 = reed_solomon_find_syndromes
                      (field_01,msgpoly,
                       (field_logarithm_t **)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (field_element_t *)syndromes,
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    uVar11 = CONCAT13(_Var2,(int3)in_stack_ffffffffffffff94);
    if (_Var2) {
      for (uVar13 = 0; uVar13 < local_8; uVar13 = uVar13 + 1) {
        *(undefined1 *)(in_R9 + (ulong)uVar13) =
             *(undefined1 *)(in_RDI[0x10] + (in_RDX - (uVar13 + 1)));
      }
    }
    else {
      error_locator.coeff._4_4_ = in_stack_ffffffffffffff7c;
      error_locator.coeff._0_4_ = in_stack_ffffffffffffff78;
      error_locator.order = in_stack_ffffffffffffff80;
      error_locator._12_4_ = in_stack_ffffffffffffff84;
      reed_solomon_find_modified_syndromes
                ((correct_reed_solomon *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,error_locator,in_stack_ffffffffffffff60);
      __dest = malloc(in_RDI[2]);
      memcpy(__dest,(void *)in_RDI[0xe],in_RDI[2]);
      uVar4 = (uint)in_R8;
      for (uVar5 = uVar4; (ulong)uVar5 < in_RDI[2]; uVar5 = uVar5 + 1) {
        *(undefined1 *)(in_RDI[0xe] + (uVar5 - in_R8)) = *(undefined1 *)(in_RDI[0xf] + (ulong)uVar5)
        ;
      }
      uVar13 = reed_solomon_find_error_locator
                         ((correct_reed_solomon *)CONCAT44(in_stack_ffffffffffffffa4,uVar13),
                          (size_t)pfVar6);
      *(uint *)(in_RDI + 0x13) = uVar13;
      for (uVar12 = 0; uVar12 <= (uint)in_RDI[0x13]; uVar12 = uVar12 + 1) {
        *(undefined1 *)(in_RDI[0x14] + (ulong)uVar12) =
             *(undefined1 *)(in_RDI[5] + (ulong)*(byte *)(in_RDI[0x12] + (ulong)uVar12));
      }
      *(int *)(in_RDI + 0x15) = (int)in_RDI[0x13];
      field_00.log = in_stack_ffffffffffffff60;
      field_00.exp = in_stack_ffffffffffffff58;
      locator_log.order = in_stack_ffffffffffffff50;
      locator_log.coeff = (field_element_t *)syndromes;
      locator_log._12_4_ = in_stack_ffffffffffffff54;
      _Var2 = reed_solomon_factorize_error_locator
                        (field_00,in_stack_ffffffffffffff44,locator_log,
                         (field_element_t *)in_RDI[0x1b],
                         (field_logarithm_t **)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      generator_root_gap = (field_logarithm_t)((uint)in_stack_ffffffffffffff54 >> 0x18);
      if (_Var2) {
        pVar9 = polynomial_create(0);
        pfVar7 = pVar9.coeff;
        uVar8 = pVar9.order;
        num_errors = pVar9.coeff._4_4_;
        field_02.exp._4_4_ = uVar12;
        field_02.exp._0_4_ = in_stack_ffffffffffffff78;
        field_02.log._0_4_ = uVar13;
        field_02.log._4_4_ = uVar5;
        l._12_4_ = in_stack_ffffffffffffff74;
        l.coeff = (field_element_t *)SUB128(pVar9._0_12_,0);
        l.order = SUB124(pVar9._0_12_,8);
        r._8_8_ = in_stack_ffffffffffffff60;
        r.coeff = in_stack_ffffffffffffff58;
        res.coeff._4_4_ = uVar11;
        res.coeff._0_4_ = in_stack_ffffffffffffff90;
        res._8_8_ = pfVar6;
        uVar13 = uVar8;
        uVar11 = in_stack_ffffffffffffff74;
        polynomial_mul(field_02,l,r,res);
        pfVar6 = ((field_t *)(in_RDI + 0x12))->exp;
        uVar10 = in_RDI[0x13];
        fVar1 = *(field_t *)(in_RDI + 0x12);
        in_RDI[0x12] = (ulong)pfVar7;
        in_RDI[0x13] = CONCAT44(uVar11,uVar13);
        reed_solomon_find_error_locations
                  (fVar1,generator_root_gap,(field_element_t *)syndromes,
                   (field_logarithm_t *)CONCAT44(in_stack_ffffffffffffff74,uVar8),num_errors,uVar13)
        ;
        memcpy((void *)in_RDI[0xe],__dest,in_RDI[2]);
        reed_solomon_find_error_values((correct_reed_solomon *)CONCAT44(uVar11,uVar13));
        for (uVar13 = 0; uVar13 < (uint)in_RDI[0x13]; uVar13 = uVar13 + 1) {
          fVar3 = field_sub(*(field_t *)(in_RDI + 4),
                            *(field_element_t *)
                             (in_RDI[0x10] + (ulong)*(byte *)(in_RDI[0x1a] + (ulong)uVar13)),
                            *(field_element_t *)(in_RDI[0x19] + (ulong)uVar13));
          *(field_element_t *)(in_RDI[0x10] + (ulong)*(byte *)(in_RDI[0x1a] + (ulong)uVar13)) =
               fVar3;
        }
        in_RDI[0x12] = (ulong)pfVar6;
        in_RDI[0x13] = uVar10;
        for (uVar13 = 0; uVar13 < local_8; uVar13 = uVar13 + 1) {
          *(undefined1 *)(in_R9 + (ulong)uVar13) =
               *(undefined1 *)(in_RDI[0x10] + (in_RDX - (uVar13 + 1)));
        }
        polynomial.coeff._4_4_ = num_errors;
        polynomial.coeff._0_4_ = uVar4;
        polynomial.order = uVar8;
        polynomial._12_4_ = in_stack_ffffffffffffff74;
        polynomial_destroy(polynomial);
        free(__dest);
      }
      else {
        free(__dest);
        local_8 = 0xffffffffffffffff;
      }
    }
  }
  return local_8;
}

Assistant:

ssize_t correct_reed_solomon_decode_with_erasures(correct_reed_solomon *rs, const uint8_t *encoded,
                                                  size_t encoded_length, const uint8_t *erasure_locations,
                                                  size_t erasure_length, uint8_t *msg) {
    if (!erasure_length) {
        return correct_reed_solomon_decode(rs, encoded, encoded_length, msg);
    }

    if (encoded_length > rs->block_length) {
        return -1;
    }

    if (erasure_length > rs->min_distance) {
        return -1;
    }

    // the message is the non-remainder part
    size_t msg_length = encoded_length - rs->min_distance;
    // if they handed us a nonfull block, we'll write in 0s
    size_t pad_length = rs->block_length - encoded_length;

    if (!rs->has_init_decode) {
        // initialize rs for decoding
        correct_reed_solomon_decoder_create(rs);
    }

    // we need to copy to our local buffer
    // the buffer we're given has the coordinates in the wrong direction
    // e.g. byte 0 corresponds to the 254th order coefficient
    // so we're going to flip and then write padding
    // the final copied buffer will look like
    // | rem (rs->min_distance) | msg (msg_length) | pad (pad_length) |

    for (unsigned int i = 0; i < encoded_length; i++) {
        rs->received_polynomial.coeff[i] = encoded[encoded_length - (i + 1)];
    }

    // fill the pad_length with 0s
    for (unsigned int i = 0; i < pad_length; i++) {
        rs->received_polynomial.coeff[i + encoded_length] = 0;
    }

    for (unsigned int i = 0; i < erasure_length; i++) {
        // remap the coordinates of the erasures
        rs->error_locations[i] = rs->block_length - (erasure_locations[i] + pad_length + 1);
    }

    reed_solomon_find_error_roots_from_locations(rs->field, rs->generator_root_gap, rs->error_locations,
                                                 rs->error_roots, erasure_length);

    rs->erasure_locator =
        reed_solomon_find_error_locator_from_roots(rs->field, erasure_length, rs->error_roots, rs->erasure_locator, rs->init_from_roots_scratch);

    bool all_zero = reed_solomon_find_syndromes(rs->field, rs->received_polynomial, rs->generator_root_exp,
                                                rs->syndromes, rs->min_distance);

    if (all_zero) {
        // syndromes were all zero, so there was no error in the message
        // copy to msg and we are done
        for (unsigned int i = 0; i < msg_length; i++) {
            msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
        }
        return msg_length;
    }

    reed_solomon_find_modified_syndromes(rs, rs->syndromes, rs->erasure_locator, rs->modified_syndromes);

    field_element_t *syndrome_copy = malloc(rs->min_distance * sizeof(field_element_t));
    memcpy(syndrome_copy, rs->syndromes, rs->min_distance * sizeof(field_element_t));

    for (unsigned int i = erasure_length; i < rs->min_distance; i++) {
        rs->syndromes[i - erasure_length] = rs->modified_syndromes[i];
    }

    unsigned int order = reed_solomon_find_error_locator(rs, erasure_length);
    // XXX fix this vvvv
    rs->error_locator.order = order;

    for (unsigned int i = 0; i <= rs->error_locator.order; i++) {
        // this is a little strange since the coeffs are logs, not elements
        // also, we'll be storing log(0) = 0 for any 0 coeffs in the error locator
        // that would seem bad but we'll just be using this in chien search, and we'll skip all 0 coeffs
        // (you might point out that log(1) also = 0, which would seem to alias. however, that's ok,
        //   because log(1) = 255 as well, and in fact that's how it's represented in our log table)
        rs->error_locator_log.coeff[i] = rs->field.log[rs->error_locator.coeff[i]];
    }
    rs->error_locator_log.order = rs->error_locator.order;

    /*
    for (unsigned int i = 0; i < erasure_length; i++) {
        rs->error_roots[i] = field_div(rs->field, 1, rs->error_roots[i]);
    }
    */

    if (!reed_solomon_factorize_error_locator(rs->field, erasure_length, rs->error_locator_log, rs->error_roots, rs->element_exp)) {
        // roots couldn't be found, so there were too many errors to deal with
        // RS has failed for this message
        free(syndrome_copy);
        return -1;
    }

    polynomial_t temp_poly = polynomial_create(rs->error_locator.order + erasure_length);
    polynomial_mul(rs->field, rs->erasure_locator, rs->error_locator, temp_poly);
    polynomial_t placeholder_poly = rs->error_locator;
    rs->error_locator = temp_poly;

    reed_solomon_find_error_locations(rs->field, rs->generator_root_gap, rs->error_roots, rs->error_locations,
                                      rs->error_locator.order, erasure_length);

    memcpy(rs->syndromes, syndrome_copy, rs->min_distance * sizeof(field_element_t));

    reed_solomon_find_error_values(rs);

    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        rs->received_polynomial.coeff[rs->error_locations[i]] =
            field_sub(rs->field, rs->received_polynomial.coeff[rs->error_locations[i]], rs->error_vals[i]);
    }

    rs->error_locator = placeholder_poly;

    for (unsigned int i = 0; i < msg_length; i++) {
        msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
    }

    polynomial_destroy(temp_poly);
    free(syndrome_copy);

    return msg_length;
}